

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eco_mem.cpp
# Opt level: O0

void * operator_new__(size_t size)

{
  bad_alloc *pbVar1;
  void *pvVar2;
  void *ptr;
  size_t size_local;
  
  if (size == 0) {
    pbVar1 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(pbVar1);
    __cxa_throw(pbVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  pvVar2 = malloc(size);
  if (pvVar2 == (void *)0x0) {
    pbVar1 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(pbVar1);
    __cxa_throw(pbVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return pvVar2;
}

Assistant:

void* operator new[](size_t size) noexcept(false)
{
  if (size < 1)
    throw std::bad_alloc();
  /* malloc */
  void *ptr = eco_malloc(size);
  if (!ptr)
    throw std::bad_alloc();
  return ptr;
}